

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O2

LispPTR UFS_renamefile(LispPTR *args)

{
  uint uVar1;
  int iVar2;
  LispPTR LVar3;
  LispPTR *pLVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  DLword *pDVar8;
  LispPTR unaff_EBP;
  char fbuf [4096];
  char dst [4096];
  char src [4096];
  
  iVar2 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar2 != 0) {
    *Lisp_errno = 100;
    return 0;
  }
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);
  pLVar4 = NativeAligned4FromLAddr(*args);
  if (*(char *)((long)pLVar4 + 6) == 'D') {
    LVar3 = pLVar4[2] * 2;
LAB_0012ecbc:
    if (0xfff < (int)LVar3) goto LAB_0012ed0d;
    unaff_EBP = LVar3 + 1;
  }
  else {
    if (*(char *)((long)pLVar4 + 6) == 'C') {
      LVar3 = pLVar4[2];
      goto LAB_0012ecbc;
    }
    error("LispStringLength: Not a character array.\n");
  }
  pLVar4 = NativeAligned4FromLAddr(args[1]);
  if (*(char *)((long)pLVar4 + 6) == 'D') {
    unaff_EBP = pLVar4[2] * 2;
  }
  else if (*(char *)((long)pLVar4 + 6) == 'C') {
    unaff_EBP = pLVar4[2];
  }
  else {
    error("LispStringLength: Not a character array.\n");
  }
  if ((int)unaff_EBP < 0x1000) {
    pLVar4 = NativeAligned4FromLAddr(*args);
    LVar3 = 0x1000;
    if ((int)pLVar4[2] < 0x1000) {
      LVar3 = pLVar4[2];
    }
    lVar5 = (long)(int)LVar3;
    if (*(char *)((long)pLVar4 + 6) == 'D') {
      pDVar8 = Lisp_world + (ulong)(ushort)pLVar4[1] + (ulong)(*pLVar4 & 0xfffffff);
      for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 1) {
        fbuf[lVar7] = *(char *)((ulong)pDVar8 ^ 2);
        pDVar8 = pDVar8 + 1;
      }
      fbuf[lVar7] = '\0';
    }
    else if (*(char *)((long)pLVar4 + 6) == 'C') {
      uVar1 = *pLVar4;
      LVar3 = pLVar4[1];
      for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 1) {
        fbuf[lVar7] = *(char *)((long)Lisp_world +
                                lVar7 + (ulong)(ushort)LVar3 + (ulong)(uVar1 & 0xfffffff) * 2 ^ 3);
      }
      fbuf[lVar5] = '\0';
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    iVar2 = unixpathname(fbuf,src,0,0);
    if (iVar2 == 0) {
      return 0;
    }
    pLVar4 = NativeAligned4FromLAddr(args[1]);
    LVar3 = 0x1000;
    if ((int)pLVar4[2] < 0x1000) {
      LVar3 = pLVar4[2];
    }
    lVar5 = (long)(int)LVar3;
    if (*(char *)((long)pLVar4 + 6) == 'D') {
      pDVar8 = Lisp_world + (ulong)(ushort)pLVar4[1] + (ulong)(*pLVar4 & 0xfffffff);
      for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 1) {
        fbuf[lVar7] = *(char *)((ulong)pDVar8 ^ 2);
        pDVar8 = pDVar8 + 1;
      }
      fbuf[lVar7] = '\0';
    }
    else if (*(char *)((long)pLVar4 + 6) == 'C') {
      uVar1 = *pLVar4;
      LVar3 = pLVar4[1];
      for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 1) {
        fbuf[lVar7] = *(char *)((long)Lisp_world +
                                lVar7 + (ulong)(ushort)LVar3 + (ulong)(uVar1 & 0xfffffff) * 2 ^ 3);
      }
      fbuf[lVar5] = '\0';
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    iVar2 = unixpathname(fbuf,dst,0,0);
    if (iVar2 != 0) {
      alarm(TIMEOUT_TIME);
      piVar6 = __errno_location();
      do {
        *piVar6 = 0;
        iVar2 = rename(src,dst);
        if (iVar2 != -1) {
          alarm(0);
          return 0x4c;
        }
      } while (*piVar6 == 4);
      alarm(0);
      *Lisp_errno = *piVar6;
      return 0;
    }
    return 0;
  }
LAB_0012ed0d:
  *Lisp_errno = 200;
  return 0;
}

Assistant:

LispPTR UFS_renamefile(LispPTR *args)
{
  char fbuf[MAXPATHLEN], src[MAXPATHLEN], dst[MAXPATHLEN];
  int rval, len;

  ERRSETJMP(NIL);
  Lisp_errno = (int *)(NativeAligned4FromLAddr(args[2]));

  LispStringLength(args[0], len, rval);
  len += 1;
  if (len > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringLength(args[1], len, rval);
  len += 1;
  if (len > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringToCString(args[0], fbuf, MAXPATHLEN);
#ifdef DOS
  if (unixpathname(fbuf, src, 0, 0, 0, 0, 0) == 0) return (NIL);
#else
  if (unixpathname(fbuf, src, 0, 0) == 0) return (NIL);
#endif /* DOS */
  LispStringToCString(args[1], fbuf, MAXPATHLEN);
#ifdef DOS
  if (unixpathname(fbuf, dst, 0, 0, 0, 0, 0) == 0) return (NIL);
#else
  if (unixpathname(fbuf, dst, 0, 0) == 0) return (NIL);
#endif /* DOS */

  TIMEOUT(rval = rename(src, dst));
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }

  return (ATOM_T);
}